

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O2

CNodeState **
inline_assertion_check<true,(anonymous_namespace)::CNodeState*>
          (CNodeState **val,char *file,int line,char *func,char *assertion)

{
  long lVar1;
  string_view assertion_00;
  size_t sVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  string_view file_00;
  string_view func_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*val == (CNodeState *)0x0) {
    sVar2 = strlen((char *)CONCAT44(in_register_00000014,line));
    sVar3 = strlen(func);
    assertion_00._M_str = func;
    assertion_00._M_len = sVar3;
    file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
    ;
    file_00._M_len = 0x62;
    func_00._M_str = (char *)CONCAT44(in_register_00000014,line);
    func_00._M_len = sVar2;
    assertion_fail(file_00,(int)file,func_00,assertion_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return val;
  }
  __stack_chk_fail();
}

Assistant:

T&& inline_assertion_check(LIFETIMEBOUND T&& val, [[maybe_unused]] const char* file, [[maybe_unused]] int line, [[maybe_unused]] const char* func, [[maybe_unused]] const char* assertion)
{
    if constexpr (IS_ASSERT
#ifdef ABORT_ON_FAILED_ASSUME
                  || true
#endif
    ) {
        if (!val) {
            assertion_fail(file, line, func, assertion);
        }
    }
    return std::forward<T>(val);
}